

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

tdefl_status (anonymous_namespace)::miniz::tdefl_flush_output_buffer(tdefl_compressor *d)

{
  bool bVar1;
  size_t local_20;
  size_t n;
  tdefl_compressor *d_local;
  
  if (d->m_pIn_buf_size != (size_t *)0x0) {
    *d->m_pIn_buf_size = (long)d->m_pSrc - (long)d->m_pIn_buf;
  }
  if (d->m_pOut_buf_size != (size_t *)0x0) {
    if (*d->m_pOut_buf_size - d->m_out_buf_ofs < (ulong)d->m_output_flush_remaining) {
      local_20 = *d->m_pOut_buf_size - d->m_out_buf_ofs;
    }
    else {
      local_20 = (size_t)d->m_output_flush_remaining;
    }
    memcpy((void *)((long)d->m_pOut_buf + d->m_out_buf_ofs),d->m_output_buf + d->m_output_flush_ofs,
           local_20);
    d->m_output_flush_ofs = (int)local_20 + d->m_output_flush_ofs;
    d->m_output_flush_remaining = d->m_output_flush_remaining - (int)local_20;
    d->m_out_buf_ofs = local_20 + d->m_out_buf_ofs;
    *d->m_pOut_buf_size = d->m_out_buf_ofs;
  }
  bVar1 = false;
  if (d->m_finished != 0) {
    bVar1 = d->m_output_flush_remaining == 0;
  }
  return (uint)bVar1;
}

Assistant:

static tdefl_status tdefl_flush_output_buffer(tdefl_compressor *d) {
  if (d->m_pIn_buf_size) {
    *d->m_pIn_buf_size = d->m_pSrc - (const mz_uint8 *)d->m_pIn_buf;
  }

  if (d->m_pOut_buf_size) {
    size_t n = MZ_MIN(*d->m_pOut_buf_size - d->m_out_buf_ofs,
                      d->m_output_flush_remaining);
    memcpy((mz_uint8 *)d->m_pOut_buf + d->m_out_buf_ofs,
           d->m_output_buf + d->m_output_flush_ofs, n);
    d->m_output_flush_ofs += (mz_uint)n;
    d->m_output_flush_remaining -= (mz_uint)n;
    d->m_out_buf_ofs += n;

    *d->m_pOut_buf_size = d->m_out_buf_ofs;
  }

  return (d->m_finished && !d->m_output_flush_remaining) ? TDEFL_STATUS_DONE
                                                         : TDEFL_STATUS_OKAY;
}